

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O3

void __thiscall Assimp::DXF::PolyLine::PolyLine(PolyLine *this,PolyLine *param_1)

{
  pointer pcVar1;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->positions,&param_1->positions);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            (&this->colors,&param_1->colors);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->indices,&param_1->indices)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->counts,&param_1->counts);
  this->flags = param_1->flags;
  (this->layer)._M_dataplus._M_p = (pointer)&(this->layer).field_2;
  pcVar1 = (param_1->layer)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->layer,pcVar1,pcVar1 + (param_1->layer)._M_string_length);
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  pcVar1 = (param_1->desc)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->desc,pcVar1,pcVar1 + (param_1->desc)._M_string_length);
  return;
}

Assistant:

PolyLine()
    : flags() {
        // empty
    }